

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O2

bool __thiscall
Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::isEqual
          (TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *this,
          QExpression *left,QExpression *right)

{
  bool bVar1;
  QNumberType QVar2;
  bool bVar3;
  Value<char> *this_00;
  Value<char> *this_01;
  SizeT right_length;
  SizeT left_length;
  char *right_content;
  char *left_content;
  uint local_40;
  uint local_3c;
  char *local_38;
  char *local_30;
  
  local_30 = (char *)0x0;
  local_38 = (char *)0x0;
  local_3c = 0;
  local_40 = 0;
  bVar1 = true;
  if (left->Type - 1 < 3) {
    this_00 = (Value<char> *)0x0;
  }
  else if (left->Type == Variable) {
    this_00 = getValue(this,(VariableTag *)left);
    if (this_00 == (Value<char> *)0x0) {
      return false;
    }
    QVar2 = Value<char>::GetNumberType(this_00);
    if (QVar2 == NotANumber) {
      bVar3 = Value<char>::SetCharAndLength<unsigned_int>(this_00,&local_30,&local_3c);
      bVar1 = false;
      if (!bVar3) {
        return false;
      }
    }
    else {
      QVar2 = Value<char>::SetNumber(this_00,(QNumber64 *)left);
      if (QVar2 == Real) {
        left->Type = RealNumber;
      }
      else if (QVar2 == Integer) {
        left->Type = IntegerNumber;
      }
      else if (QVar2 == Natural) {
        left->Type = NaturalNumber;
      }
    }
  }
  else {
    this_00 = (Value<char> *)0x0;
    bVar1 = false;
    local_30 = this->content_ + (left->field_0).SubExpressions.index_;
    local_3c = (left->field_0).SubExpressions.capacity_;
  }
  if (right->Type - 1 < 3) {
LAB_00112997:
    if (!bVar1) {
      if (this_00 == (Value<char> *)0x0) {
        return false;
      }
      QVar2 = Value<char>::SetNumber(this_00,(QNumber64 *)left);
      if (QVar2 == Real) {
        left->Type = RealNumber;
      }
      else if (QVar2 == Integer) {
        left->Type = IntegerNumber;
      }
      else {
        if (QVar2 != Natural) {
          return false;
        }
        left->Type = NaturalNumber;
      }
    }
  }
  else {
    if (right->Type != Variable) {
      local_38 = this->content_ + (right->field_0).SubExpressions.index_;
      local_40 = (right->field_0).SubExpressions.capacity_;
      if (bVar1) {
        return false;
      }
LAB_00112ac5:
      if (local_3c == local_40) {
        bVar1 = StringUtils::IsEqual<char>(local_30,local_38,local_3c);
      }
      else {
        bVar1 = false;
      }
      goto LAB_001129a7;
    }
    this_01 = getValue(this,(VariableTag *)right);
    if (this_01 == (Value<char> *)0x0) {
      return false;
    }
    QVar2 = Value<char>::GetNumberType(this_01);
    if (QVar2 != NotANumber) {
      QVar2 = Value<char>::SetNumber(this_01,(QNumber64 *)right);
      if ((byte)(QVar2 - Real) < 3) {
        right->Type = QVar2;
      }
      goto LAB_00112997;
    }
    bVar3 = Value<char>::SetCharAndLength<unsigned_int>(this_01,&local_38,&local_40);
    if (!bVar3) {
      return false;
    }
    if (!bVar1) goto LAB_00112ac5;
    QVar2 = Value<char>::SetNumber(this_01,(QNumber64 *)right);
    if (QVar2 == Real) {
      right->Type = RealNumber;
    }
    else if (QVar2 == Integer) {
      right->Type = IntegerNumber;
    }
    else {
      if (QVar2 != Natural) {
        return false;
      }
      right->Type = NaturalNumber;
    }
  }
  bVar1 = QExpression::operator==(left,right);
LAB_001129a7:
  *(ulong *)&left->field_0 = (ulong)bVar1;
  left->Type = NaturalNumber;
  return true;
}

Assistant:

bool isEqual(QExpression &left, QExpression &right) const noexcept {
        const Value_T *left_value        = nullptr;
        const Value_T *right_value       = nullptr;
        const Char_T  *left_content      = nullptr;
        const Char_T  *right_content     = nullptr;
        SizeT          left_length       = 0;
        SizeT          right_length      = 0;
        bool           left_is_a_number  = false;
        bool           right_is_a_number = false;

        switch (left.Type) {
            case ExpressionType::RealNumber:
            case ExpressionType::NaturalNumber:
            case ExpressionType::IntegerNumber: {
                left_is_a_number = true;
                break;
            }

            case ExpressionType::Variable: {
                left_value = getValue(left.Variable);

                if (left_value != nullptr) {
                    if (left_value->GetNumberType() != QNumberType::NotANumber) {
                        left_is_a_number = true;

                        switch (left_value->SetNumber(left.Value.Number)) {
                            case QNumberType::Natural: {
                                left.Type = ExpressionType::NaturalNumber;
                                break;
                            }

                            case QNumberType::Integer: {
                                left.Type = ExpressionType::IntegerNumber;
                                break;
                            }

                            case QNumberType::Real: {
                                left.Type = ExpressionType::RealNumber;
                                break;
                            }

                            default: {
                            }
                        }
                    } else if (!(left_value->SetCharAndLength(left_content, left_length))) {
                        return false;
                    }

                    break;
                }

                return false;
            }

            default: {
                left_content = (content_ + left.Value.Offset);
                left_length  = left.Value.Length;
            }
        }

        switch (right.Type) {
            case ExpressionType::RealNumber:
            case ExpressionType::NaturalNumber:
            case ExpressionType::IntegerNumber: {
                right_is_a_number = true;
                break;
            }

            case ExpressionType::Variable: {
                right_value = getValue(right.Variable);

                if (right_value != nullptr) {
                    if (right_value->GetNumberType() != QNumberType::NotANumber) {
                        right_is_a_number = true;

                        switch (right_value->SetNumber(right.Value.Number)) {
                            case QNumberType::Natural: {
                                right.Type = ExpressionType::NaturalNumber;
                                break;
                            }

                            case QNumberType::Integer: {
                                right.Type = ExpressionType::IntegerNumber;
                                break;
                            }

                            case QNumberType::Real: {
                                right.Type = ExpressionType::RealNumber;
                                break;
                            }

                            default: {
                            }
                        }
                    } else if (!(right_value->SetCharAndLength(right_content, right_length))) {
                        return false;
                    }

                    break;
                }

                return false;
            }

            default: {
                right_content     = (content_ + right.Value.Offset);
                right_length      = right.Value.Length;
                right_is_a_number = false;
            }
        }

        if (left_is_a_number || right_is_a_number) {
            if (!left_is_a_number) {
                if (left_value != nullptr) {
                    switch (left_value->SetNumber(left.Value.Number)) {
                        case QNumberType::Natural: {
                            left.Type = ExpressionType::NaturalNumber;
                            break;
                        }

                        case QNumberType::Integer: {
                            left.Type = ExpressionType::IntegerNumber;
                            break;
                        }

                        case QNumberType::Real: {
                            left.Type = ExpressionType::RealNumber;
                            break;
                        }

                        default: {
                            return false;
                        }
                    }
                } else {
                    return false;
                }
            }

            if (!right_is_a_number) {
                if (right_value != nullptr) {
                    switch (right_value->SetNumber(right.Value.Number)) {
                        case QNumberType::Natural: {
                            right.Type = ExpressionType::NaturalNumber;
                            break;
                        }

                        case QNumberType::Integer: {
                            right.Type = ExpressionType::IntegerNumber;
                            break;
                        }

                        case QNumberType::Real: {
                            right.Type = ExpressionType::RealNumber;
                            break;
                        }

                        default: {
                            return false;
                        }
                    }
                } else {
                    return false;
                }
            }

            left.Value.Number.Natural = SizeT64(left == right);
            left.Type                 = ExpressionType::NaturalNumber;
            return true;
        }

        left.Value.Number.Natural =
            ((left_length == right_length) && StringUtils::IsEqual(left_content, right_content, right_length));
        left.Type = ExpressionType::NaturalNumber;

        return true;
    }